

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_to_storage(secp256k1_fe_storage *r,secp256k1_fe *a)

{
  secp256k1_fe *in_RSI;
  secp256k1_fe_storage *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  if (in_RSI->normalized == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x17b,"test condition failed: a->normalized");
    abort();
  }
  secp256k1_fe_impl_to_storage(in_RDI,in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_to_storage(secp256k1_fe_storage *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(a->normalized);

    secp256k1_fe_impl_to_storage(r, a);
}